

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

bool __thiscall QDockAreaLayout::restoreDockWidget(QDockAreaLayout *this,QDockWidget *dockWidget)

{
  long lVar1;
  undefined4 uVar2;
  QWidget *parent;
  QPlaceHolderItem *pQVar3;
  undefined4 uVar5;
  Data *pDVar4;
  qsizetype qVar6;
  long lVar7;
  QDockAreaLayoutInfo *pQVar8;
  QLayoutItem *this_00;
  QMetaObject *widget;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QRect rect;
  QList<QDockWidgetGroupWindow_*> list;
  QDockAreaLayoutItem *local_a8;
  QString local_90;
  QList<int> local_78;
  QArrayData *local_58;
  long lStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  widget = &QDockWidgetGroupWindow::staticMetaObject;
  qt_qFindChildren_helper
            (this->mainWindow,0,0,&QDockWidgetGroupWindow::staticMetaObject,&local_58,0);
  lVar7 = lStack_50;
  if (local_48 == 0) {
LAB_003f83da:
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QObject::objectName();
    indexOfPlaceHolder(&local_78,this,&local_90);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    qVar6 = local_78.d.size;
    if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
      local_a8 = (QDockAreaLayoutItem *)0x0;
    }
    else {
      local_a8 = item(this,&local_78);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
      }
    }
    if ((undefined1 *)qVar6 == (undefined1 *)0x0) {
      bVar10 = false;
      goto LAB_003f8521;
    }
  }
  else {
    lVar1 = local_48 * 8;
    local_a8 = (QDockAreaLayoutItem *)0x0;
    lVar9 = 0;
    do {
      parent = *(QWidget **)(lVar7 + lVar9);
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar8 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)parent);
      QObject::objectName();
      QDockAreaLayoutInfo::indexOfPlaceHolder(&local_78,pQVar8,&local_90);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
      qVar6 = local_78.d.size;
      if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
        QWidget::setParent(&dockWidget->super_QWidget,parent);
        pQVar8 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)parent);
        local_a8 = QDockAreaLayoutInfo::item(pQVar8,&local_78);
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
        }
      }
    } while (((undefined1 *)qVar6 == (undefined1 *)0x0) &&
            (bVar10 = lVar1 + -8 != lVar9, lVar9 = lVar9 + 8, bVar10));
    if (local_a8 == (QDockAreaLayoutItem *)0x0) goto LAB_003f83da;
  }
  pQVar3 = local_a8->placeHolderItem;
  this_00 = (QLayoutItem *)operator_new(0x18);
  QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_00,dockWidget);
  local_a8->widgetItem = this_00;
  if (pQVar3->window == true) {
    uVar2 = (pQVar3->topLevelRect).x2;
    uVar5 = (pQVar3->topLevelRect).y2;
    rect.y1.m_i = uVar5;
    rect.x1.m_i = uVar2;
    rect._8_8_ = dockWidget;
    local_78.d._0_16_ =
         constrainedRect(*(QDockAreaLayout **)&pQVar3->topLevelRect,rect,(QWidget *)widget);
    QDockWidgetPrivate::setWindowState
              (*(QDockWidgetPrivate **)&(dockWidget->super_QWidget).field_0x8,(WindowStates)0x3,
               (QRect *)&local_78);
  }
  (**(code **)(*(long *)&dockWidget->super_QWidget + 0x68))(dockWidget,pQVar3->hidden ^ 1);
  local_a8->placeHolderItem = (QPlaceHolderItem *)0x0;
  pDVar4 = (pQVar3->objectName).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((pQVar3->objectName).d.d)->super_QArrayData,2,0x10);
    }
  }
  operator_delete(pQVar3,0x30);
  bVar10 = true;
LAB_003f8521:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayout::restoreDockWidget(QDockWidget *dockWidget)
{
    QDockAreaLayoutItem *item = nullptr;
    const auto groups =
            mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        QList<int> index = dwgw->layoutInfo()->indexOfPlaceHolder(dockWidget->objectName());
        if (!index.isEmpty()) {
            dockWidget->setParent(dwgw);
            item = const_cast<QDockAreaLayoutItem *>(&dwgw->layoutInfo()->item(index));
            break;
        }
    }
    if (!item) {
        QList<int> index = indexOfPlaceHolder(dockWidget->objectName());
        if (index.isEmpty())
            return false;
        item = const_cast<QDockAreaLayoutItem *>(&this->item(index));
    }

    QPlaceHolderItem *placeHolder = item->placeHolderItem;
    Q_ASSERT(placeHolder != nullptr);

    item->widgetItem = new QDockWidgetItem(dockWidget);

    if (placeHolder->window) {
        const QRect r = constrainedRect(placeHolder->topLevelRect, dockWidget);
        dockWidget->d_func()->setWindowState(QDockWidgetPrivate::WindowStates(
                                            {QDockWidgetPrivate::WindowState::Floating,
                                             QDockWidgetPrivate::WindowState::Unplug}), r);
    }
    dockWidget->setVisible(!placeHolder->hidden);

    item->placeHolderItem = nullptr;
    delete placeHolder;

    return true;
}